

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::BlockStatementSyntax::BlockStatementSyntax
          (BlockStatementSyntax *this,SyntaxKind kind,NamedLabelSyntax *label,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token begin,
          NamedBlockClauseSyntax *blockName,SyntaxList<slang::syntax::SyntaxNode> *items,Token end,
          NamedBlockClauseSyntax *endBlockName)

{
  size_t sVar1;
  pointer ppSVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  long lVar5;
  undefined8 uVar6;
  
  uVar6 = begin._0_8_;
  StatementSyntax::StatementSyntax(&this->super_StatementSyntax,kind,label,attributes);
  (this->begin).kind = (short)uVar6;
  (this->begin).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->begin).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->begin).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->begin).info = begin.info;
  this->blockName = blockName;
  uVar4 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar1 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr =
       (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_ptr;
  (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5868;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  if (blockName != (NamedBlockClauseSyntax *)0x0) {
    (blockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppSVar2 = (this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr;
    lVar5 = 0;
    do {
      *(BlockStatementSyntax **)(*(long *)((long)ppSVar2 + lVar5) + 8) = this;
      lVar5 = lVar5 + 8;
    } while (sVar1 << 3 != lVar5);
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

BlockStatementSyntax(SyntaxKind kind, NamedLabelSyntax* label, const SyntaxList<AttributeInstanceSyntax>& attributes, Token begin, NamedBlockClauseSyntax* blockName, const SyntaxList<SyntaxNode>& items, Token end, NamedBlockClauseSyntax* endBlockName) :
        StatementSyntax(kind, label, attributes), begin(begin), blockName(blockName), items(items), end(end), endBlockName(endBlockName) {
        if (this->blockName) this->blockName->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }